

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::do_actual_learning<true>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  pointer ppeVar3;
  action_score *paVar4;
  v_array<ACTION_SCORE::action_score> *pvVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  action_score *paVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  vw_exception *this;
  uint uVar15;
  uint32_t uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  example *peVar20;
  ulong uVar21;
  ulong uVar22;
  size_t k;
  uint uVar23;
  ulong start_K;
  size_t sVar24;
  float fVar25;
  float fVar26;
  multi_ex ec_seq;
  stringstream __msg;
  multi_ex local_208;
  ulong local_1f0;
  v_array<v_array<ACTION_SCORE::action_score>_> *local_1e8;
  v_array<ACTION_SCORE::action_score> *local_1e0;
  string local_1d8;
  action_score local_1b8 [2];
  ostream local_1a8;
  
  ppeVar3 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar3) {
    return;
  }
  data->ft_offset = ((*ppeVar3)->super_example_predict).ft_offset;
  process_labels(&local_208,data,ec_seq_all);
  ppeVar3 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar17 = (long)local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar17 != 0) {
    bVar13 = ec_seq_has_label_definition(&local_208);
    if (bVar13) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"error: label definition encountered in data block",0x31);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x1b6,&local_1d8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    bVar13 = COST_SENSITIVE::ec_is_example_header(*ppeVar3);
    uVar18 = lVar17 >> 3;
    uVar15 = (uint)uVar18;
    start_K = 0;
    if ((bVar13) && (start_K = 1, 1 < uVar15)) {
      uVar21 = 1;
      do {
        LabelDict::add_example_namespaces_from_example
                  (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21],
                   *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
        uVar21 = uVar21 + 1;
      } while ((uVar18 & 0xffffffff) != uVar21);
    }
    uVar23 = (uint)start_K;
    bVar14 = test_ldf_sequence(data,start_K,&local_208);
    uVar21 = start_K;
    local_1f0 = uVar18;
    if (data->rank == false) {
      if (uVar23 < uVar15) {
        fVar26 = 3.4028235e+38;
        sVar24 = start_K;
        do {
          peVar20 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar24];
          make_single_prediction(data,base,peVar20);
          fVar25 = peVar20->partial_prediction;
          if (fVar25 < fVar26) {
            uVar21 = sVar24 & 0xffffffff;
            fVar26 = fVar25;
          }
          sVar24 = sVar24 + 1;
        } while (uVar15 != (uint)sVar24);
      }
    }
    else {
      local_1e0 = &data->a_s;
      v_array<ACTION_SCORE::action_score>::clear(local_1e0);
      local_1e8 = &data->stored_preds;
      v_array<v_array<ACTION_SCORE::action_score>_>::clear(local_1e8);
      if (bVar13) {
        v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                  (local_1e8,
                   (v_array<ACTION_SCORE::action_score> *)
                   &((*local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->pred).scalars);
      }
      if (uVar23 < uVar15) {
        uVar18 = (ulong)(uVar23 * 8);
        uVar16 = 0;
        do {
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (local_1e8,
                     (v_array<ACTION_SCORE::action_score> *)
                     (*(long *)((long)local_208.
                                      super__Vector_base<example_*,_std::allocator<example_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + uVar18) + 0x6850));
          peVar20 = *(example **)
                     ((long)local_208.super__Vector_base<example_*,_std::allocator<example_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar18);
          make_single_prediction(data,base,peVar20);
          local_1b8[0].score = peVar20->partial_prediction;
          local_1b8[0].action = uVar16;
          v_array<ACTION_SCORE::action_score>::push_back(local_1e0,local_1b8);
          uVar16 = uVar16 + 1;
          uVar18 = uVar18 + 8;
        } while (uVar15 - uVar23 != uVar16);
      }
      paVar4 = (data->a_s)._begin;
      qsort(paVar4,(long)(data->a_s)._end - (long)paVar4 >> 3,8,ACTION_SCORE::score_comp);
      uVar18 = local_1f0;
    }
    if (!bVar14) {
      if (data->is_wap == true) {
        do_actual_learning_wap(data,base,start_K,&local_208);
      }
      else {
        do_actual_learning_oaa(data,base,start_K,&local_208);
      }
    }
    if (data->rank == false) {
      uVar22 = start_K;
      if (start_K < (uVar18 & 0xffffffff)) {
        do {
          if (uVar21 == uVar22) {
            peVar20 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar21];
            fVar26 = (float)((peVar20->l).cs.costs._begin)->class_index;
          }
          else {
            peVar20 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar22];
            fVar26 = 0.0;
          }
          (peVar20->pred).scalar = fVar26;
          uVar22 = uVar22 + 1;
        } while ((uVar18 & 0xffffffff) != uVar22);
      }
    }
    else {
      v_array<ACTION_SCORE::action_score>::clear((data->stored_preds)._begin);
      if (bVar13) {
        pvVar5 = (data->stored_preds)._begin;
        peVar20 = *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        paVar4 = pvVar5->_begin;
        paVar10 = pvVar5->_end;
        uVar7 = *(undefined4 *)((long)&pvVar5->end_array + 4);
        sVar24 = pvVar5->erase_count;
        uVar8 = *(undefined4 *)((long)&pvVar5->erase_count + 4);
        *(undefined4 *)((long)&peVar20->pred + 0x10) = *(undefined4 *)&pvVar5->end_array;
        *(undefined4 *)((long)&peVar20->pred + 0x14) = uVar7;
        *(int *)((long)&peVar20->pred + 0x18) = (int)sVar24;
        *(undefined4 *)((long)&peVar20->pred + 0x1c) = uVar8;
        (peVar20->pred).scalars._begin = (float *)paVar4;
        (peVar20->pred).scalars._end = (float *)paVar10;
      }
      lVar17 = (uVar18 & 0xffffffff) - start_K;
      if (start_K <= (uVar18 & 0xffffffff) && lVar17 != 0) {
        lVar19 = 0;
        do {
          pvVar5 = (data->stored_preds)._begin;
          lVar6 = *(long *)((long)local_208.
                                  super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar19 + (ulong)(uVar23 * 8));
          puVar1 = (undefined8 *)((long)&pvVar5->_begin + lVar19 * 4 + (ulong)(uVar23 << 5));
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar2 = (undefined4 *)((long)&pvVar5->end_array + lVar19 * 4 + (ulong)(uVar23 << 5));
          uVar7 = puVar2[1];
          uVar8 = puVar2[2];
          uVar9 = puVar2[3];
          *(undefined4 *)(lVar6 + 0x6860) = *puVar2;
          *(undefined4 *)(lVar6 + 0x6864) = uVar7;
          *(undefined4 *)(lVar6 + 0x6868) = uVar8;
          *(undefined4 *)(lVar6 + 0x686c) = uVar9;
          *(undefined8 *)(lVar6 + 0x6850) = uVar11;
          *(undefined8 *)(lVar6 + 0x6858) = uVar12;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     &((*local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->pred).scalars,
                     (action_score *)((long)&((data->a_s)._begin)->action + lVar19));
          lVar19 = lVar19 + 8;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
    }
    uVar18 = local_1f0;
    uVar15 = (uint)local_1f0;
    if ((bVar13) && (uVar21 = local_1f0 & 0xffffffff, 1 < uVar21)) {
      uVar22 = 1;
      do {
        LabelDict::del_example_namespaces_from_example
                  (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22],
                   *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    if ((data->is_probabilities != false) && (uVar18 = uVar18 & 0xffffffff, start_K < uVar18)) {
      fVar26 = 0.0;
      sVar24 = start_K;
      do {
        fVar25 = expf(local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar24]->partial_prediction);
        fVar25 = 1.0 / (fVar25 + 1.0);
        (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start[sVar24]->pred).scalar = fVar25;
        fVar26 = fVar26 + fVar25;
        sVar24 = sVar24 + 1;
      } while (uVar18 != sVar24);
      if (uVar15 <= uVar23) goto LAB_00245c22;
      do {
        (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start[start_K]->pred).scalar =
             (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start[start_K]->pred).scalar / fVar26;
        start_K = start_K + 1;
      } while (uVar18 != start_K);
    }
  }
  if (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return;
  }
LAB_00245c22:
  operator_delete(local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();
  uint32_t start_K = 0;

  if (ec_is_example_header(*ec_seq[0]))
  {
    start_K = 1;
    for (uint32_t k = 1; k < K; k++) LabelDict::add_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);
  }
  bool isTest = test_ldf_sequence(data, start_K, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = start_K;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    if (start_K > 0)
      data.stored_preds.push_back(ec_seq[0]->pred.a_s);
    for (uint32_t k = start_K; k < K; k++)
    {
      data.stored_preds.push_back(ec_seq[k]->pred.a_s);
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k - start_K;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = start_K; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, start_K, ec_seq);
    else
      do_actual_learning_oaa(data, base, start_K, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    if (start_K > 0)
    {
      ec_seq[0]->pred.a_s = data.stored_preds[0];
    }
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k - start_K]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = start_K; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }
  /////////////////////// remove header
  if (start_K > 0)
    for (size_t k = 1; k < K; k++) LabelDict::del_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (size_t k = start_K; k < K; k++)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(ec_seq[k]->partial_prediction));
      ec_seq[k]->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.prob /= sum_prob;
    }
  }
}